

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O1

TAG * __thiscall HTML::TAG::text<char[27]>(TAG *this,char (*value) [27])

{
  size_t sVar1;
  
  sVar1 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x38,*value,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(this->m_stream,">",1);
  return this;
}

Assistant:

TAG &text(const T &value) {
    m_value << value;
    text();
    return *this;
  }